

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall HighsHashTable<int,_int>::growTable(HighsHashTable<int,_int> *this)

{
  u64 uVar1;
  type puVar2;
  HighsHashTable<int,_int> *in_RDI;
  HighsHashTableEntry<int,_int> *unaff_retaddr;
  HighsHashTable<int,_int> *in_stack_00000008;
  u64 i;
  u64 oldCapactiy;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> oldMetadata;
  unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter> oldEntries;
  unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  u64 in_stack_ffffffffffffffc8;
  long lVar3;
  HighsHashTable<int,_int> *in_stack_ffffffffffffffd0;
  
  std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::unique_ptr
            ((unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffffa8);
  uVar1 = in_RDI->tableSizeMask;
  makeEmptyTable(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (lVar3 = 0; lVar3 != uVar1 + 1; lVar3 = lVar3 + 1) {
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        (size_t)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb7 = occupied(in_RDI,*puVar2);
    if ((bool)in_stack_ffffffffffffffb7) {
      std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::get
                ((unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                  *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      HighsHashTable<int,int>::insert<HighsHashTableEntry<int,int>>(in_stack_00000008,unaff_retaddr)
      ;
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::
  ~unique_ptr((unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter> *)
              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }